

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O2

void DivisionHelper<unsigned_long_long,unsigned_int,0>::
     DivideThrow<safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
               (unsigned_long_long *t,uint *u,unsigned_long_long *result)

{
  ulong uVar1;
  
  if ((ulong)*u != 0) {
    if (*t == 0) {
      uVar1 = 0;
    }
    else {
      uVar1 = *t / (ulong)*u;
    }
    *result = uVar1;
    return;
  }
  safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>::SafeIntOnDivZero();
}

Assistant:

SAFEINT_CONSTEXPR14 static void DivideThrow( const T& t, const U& u, T& result ) SAFEINT_CPP_THROW
    {
        if( u == 0 )
            E::SafeIntOnDivZero();

        if( t == 0 )
        {
            result = 0;
            return;
        }

        result = (T)( t/u );
    }